

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_table_function_info.cpp
# Opt level: O3

void __thiscall
duckdb::CreateTableFunctionInfo::CreateTableFunctionInfo
          (CreateTableFunctionInfo *this,TableFunctionSet *set)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pTVar4;
  undefined8 uVar5;
  TableFunction *func;
  pointer pTVar6;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"main","");
  CreateFunctionInfo::CreateFunctionInfo
            (&this->super_CreateFunctionInfo,TABLE_FUNCTION_ENTRY,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (this->super_CreateFunctionInfo).super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateTableFunctionInfo_01981360;
  paVar2 = &(this->functions).super_FunctionSet<duckdb::TableFunction>.name.field_2;
  (this->functions).super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p = (pointer)paVar2
  ;
  pcVar3 = (set->super_FunctionSet<duckdb::TableFunction>).name._M_dataplus._M_p;
  paVar1 = &(set->super_FunctionSet<duckdb::TableFunction>).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar5 = *(undefined8 *)((long)&(set->super_FunctionSet<duckdb::TableFunction>).name.field_2 + 8)
    ;
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)
     ((long)&(this->functions).super_FunctionSet<duckdb::TableFunction>.name.field_2 + 8) = uVar5;
  }
  else {
    (this->functions).super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p = pcVar3;
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->functions).super_FunctionSet<duckdb::TableFunction>.name._M_string_length =
       (set->super_FunctionSet<duckdb::TableFunction>).name._M_string_length;
  (set->super_FunctionSet<duckdb::TableFunction>).name._M_dataplus._M_p = (pointer)paVar1;
  (set->super_FunctionSet<duckdb::TableFunction>).name._M_string_length = 0;
  (set->super_FunctionSet<duckdb::TableFunction>).name.field_2._M_local_buf[0] = '\0';
  pTVar6 = (set->super_FunctionSet<duckdb::TableFunction>).functions.
           super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
           super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl
           .super__Vector_impl_data._M_finish;
  (this->functions).super_FunctionSet<duckdb::TableFunction>.functions.
  super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
  super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
  super__Vector_impl_data._M_start =
       (set->super_FunctionSet<duckdb::TableFunction>).functions.
       super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
       super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->functions).super_FunctionSet<duckdb::TableFunction>.functions.
           super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
           super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl
           .super__Vector_impl_data + 8) = pTVar6;
  *(pointer *)
   ((long)&(this->functions).super_FunctionSet<duckdb::TableFunction>.functions.
           super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
           super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl
           .super__Vector_impl_data + 0x10) =
       (set->super_FunctionSet<duckdb::TableFunction>).functions.
       super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
       super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (set->super_FunctionSet<duckdb::TableFunction>).functions.
  super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
  super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (set->super_FunctionSet<duckdb::TableFunction>).functions.
  super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
  super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (set->super_FunctionSet<duckdb::TableFunction>).functions.
  super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
  super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::__cxx11::string::_M_assign((string *)&(this->super_CreateFunctionInfo).name);
  pTVar4 = *(pointer *)
            ((long)&(this->functions).super_FunctionSet<duckdb::TableFunction>.functions.
                    super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
                    super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>
                    ._M_impl.super__Vector_impl_data + 8);
  for (pTVar6 = (this->functions).super_FunctionSet<duckdb::TableFunction>.functions.
                super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
                super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
                _M_impl.super__Vector_impl_data._M_start; pTVar6 != pTVar4; pTVar6 = pTVar6 + 1) {
    ::std::__cxx11::string::_M_assign
              ((string *)
               &(pTVar6->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
                name);
  }
  (this->super_CreateFunctionInfo).super_CreateInfo.internal = true;
  return;
}

Assistant:

CreateTableFunctionInfo::CreateTableFunctionInfo(TableFunctionSet set)
    : CreateFunctionInfo(CatalogType::TABLE_FUNCTION_ENTRY), functions(std::move(set)) {
	name = functions.name;
	for (auto &func : functions.functions) {
		func.name = functions.name;
	}
	internal = true;
}